

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefParamAssignmentSyntax,slang::syntax::NameSyntax&,slang::syntax::EqualsValueClauseSyntax&>
          (BumpAllocator *this,NameSyntax *args,EqualsValueClauseSyntax *args_1)

{
  DefParamAssignmentSyntax *pDVar1;
  
  pDVar1 = (DefParamAssignmentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefParamAssignmentSyntax *)this->endPtr < pDVar1 + 1) {
    pDVar1 = (DefParamAssignmentSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pDVar1 + 1);
  }
  (pDVar1->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar1->super_SyntaxNode).kind = DefParamAssignment;
  (pDVar1->name).ptr = args;
  (pDVar1->setter).ptr = args_1;
  (args->super_ExpressionSyntax).super_SyntaxNode.parent = &pDVar1->super_SyntaxNode;
  (args_1->super_SyntaxNode).parent = &pDVar1->super_SyntaxNode;
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }